

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

int pybind11_object_init(PyObject *self,PyObject *param_2,PyObject *param_3)

{
  string local_50;
  undefined1 local_30 [8];
  string msg;
  
  pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
            (&local_50,(detail *)self->ob_type,(PyTypeObject *)param_3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,": No constructor defined!");
  std::__cxx11::string::~string((string *)&local_50);
  PyErr_SetString(_PyExc_TypeError,local_30);
  std::__cxx11::string::~string((string *)local_30);
  return -1;
}

Assistant:

inline int pybind11_object_init(PyObject *self, PyObject *, PyObject *) {
    PyTypeObject *type = Py_TYPE(self);
    std::string msg = get_fully_qualified_tp_name(type) + ": No constructor defined!";
    PyErr_SetString(PyExc_TypeError, msg.c_str());
    return -1;
}